

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::GenerateUseDeclaration(bool is_descriptor,Printer *printer)

{
  char *text;
  undefined7 in_register_00000039;
  
  text = 
  "use Google\\Protobuf\\Internal\\GPBType;\nuse Google\\Protobuf\\Internal\\RepeatedField;\nuse Google\\Protobuf\\Internal\\GPBUtil;\n\n"
  ;
  if ((int)CONCAT71(in_register_00000039,is_descriptor) != 0) {
    text = 
    "use Google\\Protobuf\\Internal\\GPBType;\nuse Google\\Protobuf\\Internal\\GPBWire;\nuse Google\\Protobuf\\Internal\\RepeatedField;\nuse Google\\Protobuf\\Internal\\InputStream;\nuse Google\\Protobuf\\Internal\\GPBUtil;\n\n"
    ;
  }
  io::Printer::Print<>(printer,text);
  return;
}

Assistant:

void GenerateUseDeclaration(bool is_descriptor, io::Printer* printer) {
  if (!is_descriptor) {
    printer->Print(
        "use Google\\Protobuf\\Internal\\GPBType;\n"
        "use Google\\Protobuf\\Internal\\RepeatedField;\n"
        "use Google\\Protobuf\\Internal\\GPBUtil;\n\n");
  } else {
    printer->Print(
        "use Google\\Protobuf\\Internal\\GPBType;\n"
        "use Google\\Protobuf\\Internal\\GPBWire;\n"
        "use Google\\Protobuf\\Internal\\RepeatedField;\n"
        "use Google\\Protobuf\\Internal\\InputStream;\n"
        "use Google\\Protobuf\\Internal\\GPBUtil;\n\n");
  }
}